

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<InterfaceVariableRename,_8UL>::SmallVector
          (SmallVector<InterfaceVariableRename,_8UL> *this)

{
  InterfaceVariableRename *pIVar1;
  SmallVector<InterfaceVariableRename,_8UL> *this_local;
  
  VectorView<InterfaceVariableRename>::VectorView(&this->super_VectorView<InterfaceVariableRename>);
  this->buffer_capacity = 0;
  pIVar1 = AlignedBuffer<InterfaceVariableRename,_8UL>::data(&this->stack_storage);
  (this->super_VectorView<InterfaceVariableRename>).ptr = pIVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}